

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alprd_scan.hpp
# Opt level: O2

void duckdb::AlpRDScanPartial<double>
               (ColumnSegment *segment,ColumnScanState *state,idx_t scan_count,Vector *result,
               idx_t result_offset)

{
  data_ptr_t pdVar1;
  AlpRDScanState<double> *this;
  ulong uVar2;
  ulong vector_size;
  ulong uVar3;
  
  this = (AlpRDScanState<double> *)
         unique_ptr<duckdb::SegmentScanState,_std::default_delete<duckdb::SegmentScanState>,_true>::
         operator*(&state->scan_state);
  pdVar1 = result->data;
  Vector::SetVectorType(result,FLAT_VECTOR);
  for (uVar3 = 0; uVar2 = scan_count - uVar3, uVar3 <= scan_count && uVar2 != 0;
      uVar3 = uVar3 + vector_size) {
    vector_size = 0x400 - (ulong)((uint)this->total_value_count & 0x3ff);
    if (uVar2 < vector_size) {
      vector_size = uVar2;
    }
    AlpRDScanState<double>::ScanVector<unsigned_long,false>
              (this,(unsigned_long *)(pdVar1 + uVar3 * 8 + result_offset * 8),vector_size);
  }
  return;
}

Assistant:

void AlpRDScanPartial(ColumnSegment &segment, ColumnScanState &state, idx_t scan_count, Vector &result,
                      idx_t result_offset) {
	using EXACT_TYPE = typename FloatingToExact<T>::TYPE;
	auto &scan_state = (AlpRDScanState<T> &)*state.scan_state;

	// Get the pointer to the result values
	auto current_result_ptr = FlatVector::GetData<EXACT_TYPE>(result);
	result.SetVectorType(VectorType::FLAT_VECTOR);
	current_result_ptr += result_offset;

	idx_t scanned = 0;
	while (scanned < scan_count) {
		const auto remaining = scan_count - scanned;
		const idx_t to_scan = MinValue(remaining, scan_state.LeftInVector());

		scan_state.template ScanVector<EXACT_TYPE>(current_result_ptr + scanned, to_scan);
		scanned += to_scan;
	}
}